

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPUDPv6Transmitter::GetLocalHostName
          (RTPUDPv6Transmitter *this,uint8_t *buffer,size_t *bufferlength)

{
  list<in6_addr,_std::allocator<in6_addr>_> *plVar1;
  ushort uVar2;
  ulong __n;
  bool bVar3;
  int iVar4;
  hostent *phVar5;
  long lVar6;
  uint8_t *puVar7;
  size_t sVar8;
  _Self __tmp;
  _List_node_base *p_Var9;
  _List_node_base *p_Var10;
  bool bVar11;
  allocator<char> local_ed;
  int local_ec;
  in6_addr ip;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hostnames;
  string hname;
  string hname_1;
  
  if (this->init != true) {
    return -0x72;
  }
  if (this->created != true) {
    return -0x71;
  }
  if (this->localhostname != (uint8_t *)0x0) goto LAB_001379be;
  plVar1 = &this->localIPs;
  p_Var9 = (this->localIPs).super__List_base<in6_addr,_std::allocator<in6_addr>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var9 == (_List_node_base *)plVar1) {
    return -0x6d;
  }
  hostnames.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&hostnames;
  hostnames.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&hostnames;
  hostnames.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  for (; p_Var9 != (_List_node_base *)plVar1; p_Var9 = p_Var9->_M_next) {
    bVar11 = true;
    bVar3 = false;
    while ((bVar11 && (!bVar3))) {
      ip.__in6_u._0_8_ = p_Var9[1]._M_next;
      ip.__in6_u._8_8_ = p_Var9[1]._M_prev;
      phVar5 = gethostbyaddr(&ip,0x10,10);
      bVar11 = phVar5 != (hostent *)0x0;
      if (bVar11) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&hname,phVar5->h_name,(allocator<char> *)&hname_1);
        p_Var10 = (_List_node_base *)&hostnames;
        while (!bVar3) {
          p_Var10 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          if (p_Var10 == (_List_node_base *)&hostnames) {
            std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&hostnames,&hname);
            break;
          }
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(p_Var10 + 1),&hname);
        }
        local_ec = 0;
        while ((!bVar3 && (phVar5->h_aliases[local_ec] != (char *)0x0))) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&hname_1,phVar5->h_aliases[local_ec],&local_ed);
          p_Var10 = (_List_node_base *)&hostnames;
          while (!bVar3) {
            p_Var10 = p_Var10->_M_next;
            if (p_Var10 == (_List_node_base *)&hostnames) {
              std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&hostnames,&hname_1);
              local_ec = local_ec + 1;
              break;
            }
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(p_Var10 + 1),&hname_1);
          }
          std::__cxx11::string::~string((string *)&hname_1);
        }
        std::__cxx11::string::~string((string *)&hname);
      }
    }
  }
  if (hostnames.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&hostnames) {
LAB_001378e0:
    p_Var9 = (plVar1->super__List_base<in6_addr,_std::allocator<in6_addr>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    hname_1._M_dataplus._M_p._0_4_ = *(undefined4 *)&p_Var9[1]._M_next;
    hname_1._M_dataplus._M_p._4_4_ = *(undefined4 *)((long)&p_Var9[1]._M_next + 4);
    hname_1._M_string_length._0_4_ = *(undefined4 *)&p_Var9[1]._M_prev;
    hname_1._M_string_length._4_4_ = *(undefined4 *)((long)&p_Var9[1]._M_prev + 4);
    for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
      uVar2 = *(ushort *)((long)&hname_1._M_dataplus._M_p + lVar6 * 2);
      ip.__in6_u.__u6_addr16[lVar6] = uVar2 << 8 | uVar2 >> 8;
    }
    snprintf((char *)&hname,0x30,"%04X:%04X:%04X:%04X:%04X:%04X:%04X:%04X",ip.__in6_u._0_8_ & 0xffff
             ,(ulong)ip.__in6_u._0_8_ >> 0x10 & 0xffff,(ulong)ip.__in6_u._0_8_ >> 0x20 & 0xffff,
             (ulong)ip.__in6_u._0_8_ >> 0x30,ip.__in6_u._8_8_ & 0xffff,
             (ulong)ip.__in6_u._8_8_ >> 0x10 & 0xffff,(ulong)ip.__in6_u._8_8_ >> 0x20 & 0xffff,
             (ulong)ip.__in6_u._8_8_ >> 0x30);
    sVar8 = strlen((char *)&hname);
    this->localhostnamelength = (long)(int)sVar8;
    puVar7 = (uint8_t *)
             operator_new__((long)(int)sVar8 + 1,
                            (this->super_RTPTransmitter).super_RTPMemoryObject.mgr,0);
    this->localhostname = puVar7;
    if (puVar7 == (uint8_t *)0x0) {
LAB_001379f9:
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear(&hostnames.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
      return -1;
    }
    memcpy(puVar7,&hname,this->localhostnamelength);
    this->localhostname[this->localhostnamelength] = '\0';
  }
  else {
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::sort(&hostnames);
    bVar3 = false;
    p_Var9 = (_List_node_base *)&hostnames;
    while (p_Var9 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          !(bool)(p_Var9 == (_List_node_base *)&hostnames | bVar3)) {
      lVar6 = std::__cxx11::string::find((char)(p_Var9 + 1),0x2e);
      if (lVar6 != -1) {
        p_Var10 = p_Var9[1]._M_prev;
        this->localhostnamelength = (size_t)p_Var10;
        puVar7 = (uint8_t *)
                 operator_new__((size_t)((long)&p_Var10->_M_next + 1),
                                (this->super_RTPTransmitter).super_RTPMemoryObject.mgr,0);
        this->localhostname = puVar7;
        if (puVar7 == (uint8_t *)0x0) goto LAB_001379f9;
        memcpy(puVar7,p_Var9[1]._M_next,this->localhostnamelength);
        this->localhostname[this->localhostnamelength] = '\0';
        bVar3 = true;
      }
    }
    if (!bVar3) goto LAB_001378e0;
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&hostnames.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
LAB_001379be:
  __n = this->localhostnamelength;
  if (*bufferlength < __n) {
    *bufferlength = __n;
    iVar4 = -0x45;
  }
  else {
    memcpy(buffer,this->localhostname,__n);
    *bufferlength = this->localhostnamelength;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int RTPUDPv6Transmitter::GetLocalHostName(uint8_t *buffer,size_t *bufferlength)
{
	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;

	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTCREATED;
	}

	if (localhostname == 0)
	{
		if (localIPs.empty())
		{
			MAINMUTEX_UNLOCK
			return ERR_RTP_UDPV6TRANS_NOLOCALIPS;
		}
		
		std::list<in6_addr>::const_iterator it;
		std::list<std::string> hostnames;
	
		for (it = localIPs.begin() ; it != localIPs.end() ; it++)
		{
			bool founddouble = false;
			bool foundentry = true;

			while (!founddouble && foundentry)
			{
				struct hostent *he;
				in6_addr ip = (*it);	
			
				he = gethostbyaddr((char *)&ip,sizeof(in6_addr),AF_INET6);
				if (he != 0)
				{
					std::string hname = std::string(he->h_name);
					std::list<std::string>::const_iterator it;

					for (it = hostnames.begin() ; !founddouble && it != hostnames.end() ; it++)
						if ((*it) == hname)
							founddouble = true;

					if (!founddouble)
						hostnames.push_back(hname);

					int i = 0;
					while (!founddouble && he->h_aliases[i] != 0)
					{
						std::string hname = std::string(he->h_aliases[i]);
						
						for (it = hostnames.begin() ; !founddouble && it != hostnames.end() ; it++)
							if ((*it) == hname)
								founddouble = true;

						if (!founddouble)
						{
							hostnames.push_back(hname);
							i++;
						}
					}
				}
				else
					foundentry = false;
			}
		}
	
		bool found  = false;
		
		if (!hostnames.empty())	// try to select the most appropriate hostname
		{
			std::list<std::string>::const_iterator it;
			
			hostnames.sort();
			for (it = hostnames.begin() ; !found && it != hostnames.end() ; it++)
			{
				if ((*it).find('.') != std::string::npos)
				{
					found = true;
					localhostnamelength = (*it).length();
					localhostname = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) uint8_t [localhostnamelength+1];
					if (localhostname == 0)
					{
						MAINMUTEX_UNLOCK
						return ERR_RTP_OUTOFMEM;
					}
					memcpy(localhostname,(*it).c_str(),localhostnamelength);
					localhostname[localhostnamelength] = 0;
				}
			}
		}
	
		if (!found) // use an IP address
		{
			in6_addr ip;
			int len;
			char str[48];
			uint16_t ip16[8];
			int i,j;
				
			it = localIPs.begin();
			ip = (*it);
			
			for (i = 0,j = 0 ; j < 8 ; j++,i += 2)
			{
				ip16[j] = (((uint16_t)ip.s6_addr[i])<<8);
				ip16[j] |= ((uint16_t)ip.s6_addr[i+1]);
			}			
			
			RTP_SNPRINTF(str,48,"%04X:%04X:%04X:%04X:%04X:%04X:%04X:%04X",(int)ip16[0],(int)ip16[1],(int)ip16[2],(int)ip16[3],(int)ip16[4],(int)ip16[5],(int)ip16[6],(int)ip16[7]);
			len = strlen(str);
	
			localhostnamelength = len;
			localhostname = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) uint8_t [localhostnamelength+1];
			if (localhostname == 0)
			{
				MAINMUTEX_UNLOCK
				return ERR_RTP_OUTOFMEM;
			}
			memcpy(localhostname,str,localhostnamelength);
			localhostname[localhostnamelength] = 0;
		}
	}
	
	if ((*bufferlength) < localhostnamelength)
	{
		*bufferlength = localhostnamelength; // tell the application the required size of the buffer
		MAINMUTEX_UNLOCK
		return ERR_RTP_TRANS_BUFFERLENGTHTOOSMALL;
	}

	memcpy(buffer,localhostname,localhostnamelength);
	*bufferlength = localhostnamelength;
	
	MAINMUTEX_UNLOCK
	return 0;
}